

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjExporter.cpp
# Opt level: O0

void __thiscall Assimp::ObjExporter::WriteHeader(ObjExporter *this,ostringstream *out)

{
  uint uVar1;
  ostream *poVar2;
  ostringstream *out_local;
  ObjExporter *this_local;
  
  poVar2 = std::operator<<((ostream *)out,
                           "# File produced by Open Asset Import Library (http://www.assimp.sf.net)"
                          );
  std::operator<<(poVar2,(string *)&this->endl);
  poVar2 = std::operator<<((ostream *)out,"# (assimp v");
  uVar1 = aiGetVersionMajor();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1);
  poVar2 = std::operator<<(poVar2,'.');
  uVar1 = aiGetVersionMinor();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1);
  poVar2 = std::operator<<(poVar2,'.');
  uVar1 = aiGetVersionRevision();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1);
  poVar2 = std::operator<<(poVar2,")");
  poVar2 = std::operator<<(poVar2,(string *)&this->endl);
  std::operator<<(poVar2,(string *)&this->endl);
  return;
}

Assistant:

void ObjExporter::WriteHeader(std::ostringstream& out) {
    out << "# File produced by Open Asset Import Library (http://www.assimp.sf.net)" << endl;
    out << "# (assimp v" << aiGetVersionMajor() << '.' << aiGetVersionMinor() << '.'
        << aiGetVersionRevision() << ")" << endl  << endl;
}